

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_macro_functional_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_35a403f::ns::Employee_AMN::Employee_AMN
          (Employee_AMN *this,string *name,string *surname)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  return;
}

Assistant:

Employee_AMN(const std::string& name, const std::string& surname)
            : name_(name), surname_(surname)
        {
        }